

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O3

void Aig_TableResize(Aig_Man_t *p)

{
  uint uVar1;
  Aig_Obj_t **__ptr;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pObj;
  uint uVar3;
  Aig_Obj_t **ppAVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  timespec ts;
  timespec local_40;
  
  if (p->pTable == (Aig_Obj_t **)0x0) {
    __assert_fail("p->pTable != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                  ,0x4b,"void Aig_TableResize(Aig_Man_t *)");
  }
  clock_gettime(3,&local_40);
  __ptr = p->pTable;
  uVar1 = p->nTableSize;
  iVar9 = p->nObjs[6] + p->nObjs[5];
  uVar5 = iVar9 * 2 - 1;
  while( true ) {
    do {
      uVar6 = uVar5 + 1;
      uVar3 = uVar5 & 1;
      uVar5 = uVar6;
    } while (uVar3 != 0);
    if (uVar6 < 9) break;
    iVar7 = 5;
    while (uVar6 % (iVar7 - 2U) != 0) {
      uVar3 = iVar7 * iVar7;
      iVar7 = iVar7 + 2;
      if (uVar6 < uVar3) goto LAB_00619b0e;
    }
  }
LAB_00619b0e:
  p->nTableSize = uVar6;
  ppAVar4 = (Aig_Obj_t **)calloc(1,(long)(int)uVar6 << 3);
  p->pTable = ppAVar4;
  if ((int)uVar1 < 1) {
    iVar7 = 0;
  }
  else {
    uVar8 = 0;
    iVar7 = 0;
    do {
      pObj = __ptr[uVar8];
      while (pObj != (Aig_Obj_t *)0x0) {
        pAVar2 = (pObj->field_0).pNext;
        ppAVar4 = Aig_TableFind(p,pObj);
        if (*ppAVar4 != (Aig_Obj_t *)0x0) {
          __assert_fail("*ppPlace == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                        ,0x5c,"void Aig_TableResize(Aig_Man_t *)");
        }
        *ppAVar4 = pObj;
        (pObj->field_0).pNext = (Aig_Obj_t *)0x0;
        iVar7 = iVar7 + 1;
        pObj = pAVar2;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar1);
    iVar9 = p->nObjs[6] + p->nObjs[5];
  }
  if (iVar7 != iVar9) {
    __assert_fail("Counter == Aig_ManNodeNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                  ,0x62,"void Aig_TableResize(Aig_Man_t *)");
  }
  if (__ptr != (Aig_Obj_t **)0x0) {
    free(__ptr);
  }
  return;
}

Assistant:

void Aig_TableResize( Aig_Man_t * p )
{
    Aig_Obj_t * pEntry, * pNext;
    Aig_Obj_t ** pTableOld, ** ppPlace;
    int nTableSizeOld, Counter, i;
    abctime clk;
    assert( p->pTable != NULL );
clk = Abc_Clock();
    // save the old table
    pTableOld = p->pTable;
    nTableSizeOld = p->nTableSize;
    // get the new table
    p->nTableSize = Abc_PrimeCudd( 2 * Aig_ManNodeNum(p) ); 
    p->pTable = ABC_ALLOC( Aig_Obj_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Aig_Obj_t *) * p->nTableSize );
    // rehash the entries from the old table
    Counter = 0;
    for ( i = 0; i < nTableSizeOld; i++ )
    for ( pEntry = pTableOld[i], pNext = pEntry? pEntry->pNext : NULL; 
          pEntry; pEntry = pNext, pNext = pEntry? pEntry->pNext : NULL )
    {
        // get the place where this entry goes in the table 
        ppPlace = Aig_TableFind( p, pEntry );
        assert( *ppPlace == NULL ); // should not be there
        // add the entry to the list
        *ppPlace = pEntry;
        pEntry->pNext = NULL;
        Counter++;
    }
    assert( Counter == Aig_ManNodeNum(p) );
//    printf( "Increasing the structural table size from %6d to %6d. ", nTableSizeOld, p->nTableSize );
//    ABC_PRT( "Time", Abc_Clock() - clk );
    // replace the table and the parameters
    ABC_FREE( pTableOld );
}